

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

size_t utilMax(size_t n,...)

{
  ulong uVar1;
  ulong *puVar2;
  ulong uVar3;
  ulong *puVar4;
  uint local_d8;
  ulong local_b8 [7];
  va_list marker;
  
  puVar2 = (ulong *)&stack0x00000008;
  if (n == 0) {
    uVar1 = 0;
  }
  else {
    local_d8 = 8;
    uVar1 = 0;
    do {
      if (local_d8 < 0x29) {
        uVar3 = (ulong)local_d8;
        local_d8 = local_d8 + 8;
        puVar4 = (ulong *)((long)local_b8 + uVar3);
      }
      else {
        puVar4 = puVar2;
        puVar2 = puVar2 + 1;
      }
      n = n - 1;
      if (uVar1 < *puVar4) {
        uVar1 = *puVar4;
      }
    } while (n != 0);
  }
  return uVar1;
}

Assistant:

size_t utilMax(size_t n, ...)
{
	size_t max = 0;
	va_list marker;
	ASSERT(n > 0);
	va_start(marker, n);
	while (n--)
	{
		size_t current = va_arg(marker, size_t);
		if (current > max)
			max = current;
	}
	va_end(marker);
	return max;
}